

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StripWhitespace(string *str)

{
  int iVar1;
  char *pcVar2;
  bool local_1e;
  bool local_1d;
  int local_1c;
  int local_18;
  int last;
  int first;
  int str_length;
  string *str_local;
  
  last = std::__cxx11::string::length();
  local_18 = 0;
  while( true ) {
    local_1d = false;
    if (local_18 < last) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)str);
      local_1d = ascii_isspace(*pcVar2);
    }
    if (local_1d == false) break;
    local_18 = local_18 + 1;
  }
  if (local_18 == last) {
    std::__cxx11::string::clear();
  }
  else {
    local_1c = last;
    if (0 < local_18) {
      std::__cxx11::string::erase((ulong)str,0);
      last = last - local_18;
      local_1c = last;
    }
    do {
      iVar1 = local_1c;
      local_1c = iVar1 + -1;
      local_1e = false;
      if (-1 < local_1c) {
        pcVar2 = (char *)std::__cxx11::string::at((ulong)str);
        local_1e = ascii_isspace(*pcVar2);
      }
    } while (local_1e != false);
    if ((local_1c != last + -1) && (-1 < local_1c)) {
      std::__cxx11::string::erase((ulong)str,(long)iVar1);
    }
  }
  return;
}

Assistant:

void StripWhitespace(string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && ascii_isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && ascii_isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, string::npos);
  }
}